

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# validate.cpp
# Opt level: O2

void __thiscall
ktx::ValidationContext::error<unsigned_int&,unsigned_long,char_const(&)[14],char_const(&)[7]>
          (ValidationContext *this,IssueError *issue,uint *args,unsigned_long *args_1,
          char (*args_2) [14],char (*args_3) [7])

{
  anon_union_8_2_de49483c_for_basic_format_args<fmt::v10::basic_format_context<fmt::v10::appender,_char>_>_2
  aVar1;
  string_view fmt;
  format_args args_00;
  allocator<char> local_c1;
  undefined1 local_c0 [40];
  string local_98;
  ulong local_78 [2];
  unsigned_long local_68;
  char (*local_58) [14];
  char (*local_48) [7];
  
  this->numError = this->numError + 1;
  this->returnCode = 3;
  local_c0[0] = (issue->super_Issue).type;
  local_c0._2_2_ = (issue->super_Issue).id;
  aVar1 = (anon_union_8_2_de49483c_for_basic_format_args<fmt::v10::basic_format_context<fmt::v10::appender,_char>_>_2
           )args_3;
  std::__cxx11::string::string<std::basic_string_view<char,std::char_traits<char>>,void>
            ((string *)(local_c0 + 8),&(issue->super_Issue).message,&local_c1);
  local_78[0] = (ulong)*args;
  local_68 = *args_1;
  fmt.size_ = 0xcc42;
  fmt.data_ = (char *)(issue->super_Issue).detailsFmt._M_len;
  args_00.field_1.values_ = aVar1.values_;
  args_00.desc_ = (unsigned_long_long)local_78;
  local_58 = args_2;
  local_48 = args_3;
  ::fmt::v10::vformat_abi_cxx11_
            (&local_98,(v10 *)(issue->super_Issue).detailsFmt._M_str,fmt,args_00);
  std::function<void_(const_ktx::ValidationReport_&)>::operator()
            (&this->callback,(ValidationReport *)local_c0);
  ValidationReport::~ValidationReport((ValidationReport *)local_c0);
  return;
}

Assistant:

void error(const IssueError& issue, Args&&... args) {
        ++numError;
        returnCode = +rc::INVALID_FILE;
        callback(ValidationReport{issue.type, issue.id, std::string{issue.message}, fmt::format(issue.detailsFmt, std::forward<Args>(args)...)});
    }